

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O2

Cookie * Curl_cookie_getlist(Curl_easy *data,CookieInfo *c,char *host,char *path,_Bool secure)

{
  char cVar1;
  _Bool _Var2;
  _Bool _Var3;
  _Bool _Var4;
  byte bVar5;
  _Bool _Var6;
  int iVar7;
  size_t sVar8;
  size_t sVar9;
  Cookie *pCVar10;
  char *pcVar11;
  char *__s;
  char *pcVar12;
  size_t sVar13;
  undefined8 *__base;
  undefined8 *puVar14;
  Cookie *pCVar15;
  size_t sVar16;
  Cookie *pCVar17;
  bool bVar18;
  ulong local_58;
  
  sVar8 = cookiehash(host);
  if ((c != (CookieInfo *)0x0) && (c->cookies[sVar8] != (Cookie *)0x0)) {
    pCVar17 = (Cookie *)(c->cookies + sVar8);
    remove_expired(c);
    _Var4 = Curl_host_is_ipnum(host);
    local_58 = 0;
    sVar16 = 1;
    pCVar15 = (Cookie *)0x0;
LAB_004afed5:
    do {
      do {
        pCVar17 = pCVar17->next;
        if (pCVar17 == (Cookie *)0x0) {
          if (local_58 == 0) {
            return pCVar15;
          }
          goto LAB_004b0177;
        }
      } while ((byte)(pCVar17->secure ^ 1U | secure) != 1);
      if (pCVar17->domain != (char *)0x0) {
        bVar5 = pCVar17->tailmatch ^ 1;
        if ((bVar5 & 1) == 0 && !_Var4) {
          _Var6 = tailmatch(pCVar17->domain,host);
          if (_Var6) goto LAB_004aff3b;
          bVar5 = pCVar17->tailmatch ^ 1;
        }
        if (((bVar5 & 1) == 0 && !_Var4) ||
           (iVar7 = Curl_strcasecompare(host,pCVar17->domain), iVar7 == 0)) goto LAB_004afed5;
      }
LAB_004aff3b:
      pcVar11 = pCVar17->spath;
      if ((pcVar11 != (char *)0x0) && (sVar9 = strlen(pcVar11), sVar9 != 1)) {
        __s = (*Curl_cstrdup)(path);
        if (__s == (char *)0x0) goto LAB_004afed5;
        pcVar12 = strchr(__s,0x3f);
        if (pcVar12 != (char *)0x0) {
          *pcVar12 = '\0';
        }
        if (*__s != '/') {
          (*Curl_cfree)(__s);
          __s = (*Curl_cstrdup)("/");
          if (__s == (char *)0x0) goto LAB_004afed5;
        }
        sVar13 = strlen(__s);
        if ((sVar13 < sVar9) || (iVar7 = strncmp(pcVar11,__s,sVar9), iVar7 != 0)) {
          (*Curl_cfree)(__s);
          goto LAB_004afed5;
        }
        if (sVar9 == sVar13) {
          (*Curl_cfree)(__s);
        }
        else {
          cVar1 = __s[sVar9];
          (*Curl_cfree)(__s);
          if (cVar1 != '/') goto LAB_004afed5;
        }
      }
      pCVar10 = (Cookie *)(*Curl_ccalloc)(0x60,1);
      if (pCVar10 == (Cookie *)0x0) goto LAB_004b01a2;
      if (pCVar17->expirestr != (char *)0x0) {
        pcVar11 = (*Curl_cstrdup)(pCVar17->expirestr);
        pCVar10->expirestr = pcVar11;
        if (pcVar11 != (char *)0x0) goto LAB_004aff92;
LAB_004b0148:
        freecookie(pCVar10);
        goto LAB_004b01a2;
      }
LAB_004aff92:
      if (pCVar17->domain != (char *)0x0) {
        pcVar11 = (*Curl_cstrdup)(pCVar17->domain);
        pCVar10->domain = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_004b0148;
      }
      if (pCVar17->path != (char *)0x0) {
        pcVar11 = (*Curl_cstrdup)(pCVar17->path);
        pCVar10->path = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_004b0148;
      }
      if (pCVar17->spath != (char *)0x0) {
        pcVar11 = (*Curl_cstrdup)(pCVar17->spath);
        pCVar10->spath = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_004b0148;
      }
      if (pCVar17->name != (char *)0x0) {
        pcVar11 = (*Curl_cstrdup)(pCVar17->name);
        pCVar10->name = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_004b0148;
      }
      if (pCVar17->value != (char *)0x0) {
        pcVar11 = (*Curl_cstrdup)(pCVar17->value);
        pCVar10->value = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_004b0148;
      }
      if (pCVar17->maxage != (char *)0x0) {
        pcVar11 = (*Curl_cstrdup)(pCVar17->maxage);
        pCVar10->maxage = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_004b0148;
      }
      if (pCVar17->version != (char *)0x0) {
        pcVar11 = (*Curl_cstrdup)(pCVar17->version);
        pCVar10->version = pcVar11;
        if (pcVar11 == (char *)0x0) goto LAB_004b0148;
      }
      pCVar10->expires = pCVar17->expires;
      _Var6 = pCVar17->secure;
      _Var2 = pCVar17->livecookie;
      _Var3 = pCVar17->httponly;
      pCVar10->tailmatch = pCVar17->tailmatch;
      pCVar10->secure = _Var6;
      pCVar10->livecookie = _Var2;
      pCVar10->httponly = _Var3;
      pCVar10->creationtime = pCVar17->creationtime;
      pCVar10->next = pCVar15;
      sVar9 = local_58 + 1;
      bVar18 = local_58 < 0x95;
      pCVar15 = pCVar10;
      local_58 = sVar9;
    } while (bVar18);
    Curl_infof(data,"Included max number of cookies (%zu) in request!",sVar9);
LAB_004b0177:
    __base = (undefined8 *)(*Curl_cmalloc)(local_58 * 8);
    puVar14 = __base;
    if (__base != (undefined8 *)0x0) {
      for (; pCVar15 != (Cookie *)0x0; pCVar15 = pCVar15->next) {
        *puVar14 = pCVar15;
        puVar14 = puVar14 + 1;
      }
      qsort(__base,local_58,8,cookie_sort);
      pCVar17 = (Cookie *)*__base;
      pCVar15 = pCVar17;
      for (; local_58 != sVar16; sVar16 = sVar16 + 1) {
        pCVar10 = (Cookie *)__base[sVar16];
        pCVar15->next = pCVar10;
        pCVar15 = pCVar10;
      }
      *(undefined8 *)__base[local_58 - 1] = 0;
      (*Curl_cfree)(__base);
      return pCVar17;
    }
LAB_004b01a2:
    Curl_cookie_freelist(pCVar15);
  }
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *Curl_cookie_getlist(struct Curl_easy *data,
                                   struct CookieInfo *c,
                                   const char *host, const char *path,
                                   bool secure)
{
  struct Cookie *newco;
  struct Cookie *co;
  struct Cookie *mainco = NULL;
  size_t matches = 0;
  bool is_ip;
  const size_t myhash = cookiehash(host);

  if(!c || !c->cookies[myhash])
    return NULL; /* no cookie struct or no cookies in the struct */

  /* at first, remove expired cookies */
  remove_expired(c);

  /* check if host is an IP(v4|v6) address */
  is_ip = Curl_host_is_ipnum(host);

  co = c->cookies[myhash];

  while(co) {
    /* if the cookie requires we're secure we must only continue if we are! */
    if(co->secure?secure:TRUE) {

      /* now check if the domain is correct */
      if(!co->domain ||
         (co->tailmatch && !is_ip && tailmatch(co->domain, host)) ||
         ((!co->tailmatch || is_ip) && strcasecompare(host, co->domain)) ) {
        /*
         * the right part of the host matches the domain stuff in the
         * cookie data
         */

        /*
         * now check the left part of the path with the cookies path
         * requirement
         */
        if(!co->spath || pathmatch(co->spath, path) ) {

          /*
           * and now, we know this is a match and we should create an
           * entry for the return-linked-list
           */

          newco = dup_cookie(co);
          if(newco) {
            /* then modify our next */
            newco->next = mainco;

            /* point the main to us */
            mainco = newco;

            matches++;
            if(matches >= MAX_COOKIE_SEND_AMOUNT) {
              infof(data, "Included max number of cookies (%zu) in request!",
                    matches);
              break;
            }
          }
          else
            goto fail;
        }
      }
    }
    co = co->next;
  }

  if(matches) {
    /*
     * Now we need to make sure that if there is a name appearing more than
     * once, the longest specified path version comes first. To make this
     * the swiftest way, we just sort them all based on path length.
     */
    struct Cookie **array;
    size_t i;

    /* alloc an array and store all cookie pointers */
    array = malloc(sizeof(struct Cookie *) * matches);
    if(!array)
      goto fail;

    co = mainco;

    for(i = 0; co; co = co->next)
      array[i++] = co;

    /* now sort the cookie pointers in path length order */
    qsort(array, matches, sizeof(struct Cookie *), cookie_sort);

    /* remake the linked list order according to the new order */

    mainco = array[0]; /* start here */
    for(i = 0; i<matches-1; i++)
      array[i]->next = array[i + 1];
    array[matches-1]->next = NULL; /* terminate the list */

    free(array); /* remove the temporary data again */
  }

  return mainco; /* return the new list */

fail:
  /* failure, clear up the allocated chain and return NULL */
  Curl_cookie_freelist(mainco);
  return NULL;
}